

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  CodedInputStream *pCVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  WireType WVar5;
  string *psVar6;
  char *pcVar7;
  DescriptorProto *value_00;
  EnumDescriptorProto *value_01;
  ServiceDescriptorProto *value_02;
  FieldDescriptorProto *value_03;
  FileOptions *value_04;
  SourceCodeInfo *value_05;
  RepeatedField<int> *pRVar8;
  UnknownFieldSet *unknown_fields;
  char local_33d;
  char local_30d;
  uint32 tag;
  CodedInputStream *input_local;
  FileDescriptorProto *this_local;
  uint32 local_1f0;
  int local_d8;
  uint32 local_d4;
  int elements_already_reserved_1;
  int value_1;
  CodedInputStream *local_c8;
  uint local_c0;
  undefined4 local_bc;
  char local_b5;
  uint local_b4;
  CodedInputStream *local_b0;
  char local_a1;
  int local_a0;
  uint32 local_9c;
  int elements_already_reserved;
  int value;
  CodedInputStream *local_90;
  uint local_88;
  undefined4 local_84;
  char local_7d;
  uint local_7c;
  CodedInputStream *local_78;
  char local_6d;
  uint32 local_6c;
  uint32 *puStack_68;
  uint32 temp_1;
  CodedInputStream *local_60;
  undefined1 local_55;
  uint32 local_54;
  uint32 *puStack_50;
  uint32 temp;
  CodedInputStream *local_48;
  undefined1 local_3d;
  uint32 local_3c;
  uint32 *puStack_38;
  uint32 temp_3;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp_2;
  CodedInputStream *local_18;
  undefined1 local_9;
  
LAB_002edd77:
  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
    input->last_tag_ = (uint)*input->buffer_;
    io::CodedInputStream::Advance(input,1);
    local_1f0 = input->last_tag_;
  }
  else {
    uVar3 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar3;
    local_1f0 = input->last_tag_;
  }
  if (local_1f0 == 0) {
    return true;
  }
  iVar4 = internal::WireFormatLite::GetTagFieldNumber(local_1f0);
  switch(iVar4) {
  case 1:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 != WIRETYPE_LENGTH_DELIMITED) break;
    psVar6 = mutable_name_abi_cxx11_(this);
    bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
    if (!bVar2) {
      return false;
    }
    name_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if (bVar2) {
LAB_002ee01c:
      psVar6 = mutable_package_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar2) {
        return false;
      }
      package_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      package_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
        io::CodedInputStream::Advance(input,1);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
LAB_002ee1da:
        do {
          psVar6 = add_dependency_abi_cxx11_(this);
          bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
          if (!bVar2) {
            return false;
          }
          iVar4 = dependency_size(this);
          dependency_abi_cxx11_(this,iVar4 + -1);
          pcVar7 = (char *)std::__cxx11::string::data();
          iVar4 = dependency_size(this);
          dependency_abi_cxx11_(this,iVar4 + -1);
          iVar4 = std::__cxx11::string::length();
          internal::WireFormat::VerifyUTF8String(pcVar7,iVar4,PARSE);
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
            io::CodedInputStream::Advance(input,1);
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
        } while (bVar2);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\"')) {
          io::CodedInputStream::Advance(input,1);
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (bVar2) {
LAB_002ee4dd:
          do {
            value_00 = add_message_type(this);
            bVar2 = internal::WireFormatLite::
                    ReadMessageNoVirtual<google::protobuf::DescriptorProto>(input,value_00);
            if (!bVar2) {
              return false;
            }
            if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\"')) {
              io::CodedInputStream::Advance(input,1);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          } while (bVar2);
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '*')) {
            io::CodedInputStream::Advance(input,1);
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          if (bVar2) {
LAB_002ee77f:
            do {
              value_01 = add_enum_type(this);
              bVar2 = internal::WireFormatLite::
                      ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value_01);
              if (!bVar2) {
                return false;
              }
              if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '*')) {
                io::CodedInputStream::Advance(input,1);
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            } while (bVar2);
            if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '2')) {
              io::CodedInputStream::Advance(input,1);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
            if (bVar2) {
LAB_002eea21:
              do {
                value_02 = add_service(this);
                bVar2 = internal::WireFormatLite::
                        ReadMessageNoVirtual<google::protobuf::ServiceDescriptorProto>
                                  (input,value_02);
                if (!bVar2) {
                  return false;
                }
                if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '2')) {
                  io::CodedInputStream::Advance(input,1);
                  bVar2 = true;
                }
                else {
                  bVar2 = false;
                }
              } while (bVar2);
              if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == ':')) {
                io::CodedInputStream::Advance(input,1);
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
              if (bVar2) {
LAB_002eecc3:
                do {
                  value_03 = add_extension(this);
                  bVar2 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>
                                    (input,value_03);
                  if (!bVar2) {
                    return false;
                  }
                  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == ':')) {
                    io::CodedInputStream::Advance(input,1);
                    bVar2 = true;
                  }
                  else {
                    bVar2 = false;
                  }
                } while (bVar2);
                if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'B')) {
                  io::CodedInputStream::Advance(input,1);
                  bVar2 = true;
                }
                else {
                  bVar2 = false;
                }
                if (bVar2) {
LAB_002eef65:
                  value_04 = mutable_options(this);
                  bVar2 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::FileOptions>(input,value_04);
                  if (!bVar2) {
                    return false;
                  }
                  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'J')) {
                    io::CodedInputStream::Advance(input,1);
                    bVar2 = true;
                  }
                  else {
                    bVar2 = false;
                  }
                  if (bVar2) {
LAB_002ef0e0:
                    value_05 = mutable_source_code_info(this);
                    bVar2 = internal::WireFormatLite::
                            ReadMessageNoVirtual<google::protobuf::SourceCodeInfo>(input,value_05);
                    if (!bVar2) {
                      return false;
                    }
                    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'P')) {
                      io::CodedInputStream::Advance(input,1);
                      bVar2 = true;
                    }
                    else {
                      bVar2 = false;
                    }
                    if (bVar2) {
LAB_002ef25f:
                      do {
                        _elements_already_reserved = mutable_public_dependency(this);
                        local_84 = 1;
                        local_88 = 0x50;
                        puStack_50 = &local_9c;
                        local_90 = input;
                        local_48 = input;
                        local_3d = io::CodedInputStream::ReadVarint32(input,&local_54);
                        if ((bool)local_3d) {
                          *puStack_50 = local_54;
                          RepeatedField<int>::Add(_elements_already_reserved,(int *)&local_9c);
                          iVar4 = RepeatedField<int>::Capacity(_elements_already_reserved);
                          local_a0 = RepeatedField<int>::size(_elements_already_reserved);
                          local_a0 = iVar4 - local_a0;
                          while( true ) {
                            pCVar1 = local_90;
                            local_30d = '\0';
                            if (0 < local_a0) {
                              local_78 = local_90;
                              local_7c = local_88;
                              if (local_88 < 0x80) {
                                if ((local_90->buffer_ < local_90->buffer_end_) &&
                                   (*local_90->buffer_ == local_88)) {
                                  io::CodedInputStream::Advance(local_90,1);
                                  local_6d = '\x01';
                                }
                                else {
                                  local_6d = '\0';
                                }
                              }
                              else if (local_88 < 0x4000) {
                                iVar4 = io::CodedInputStream::BufferSize(local_90);
                                if (((iVar4 < 2) ||
                                    ((uint)*pCVar1->buffer_ != (local_7c & 0xff | 0x80))) ||
                                   ((uint)pCVar1->buffer_[1] != (local_7c >> 7 & 0xff))) {
                                  local_6d = '\0';
                                }
                                else {
                                  io::CodedInputStream::Advance(pCVar1,2);
                                  local_6d = '\x01';
                                }
                              }
                              else {
                                local_6d = '\0';
                              }
                              local_30d = local_6d;
                            }
                            if (local_30d == '\0') {
                              local_7d = '\x01';
                              goto LAB_002ef4ad;
                            }
                            local_60 = local_90;
                            puStack_68 = &local_9c;
                            local_55 = io::CodedInputStream::ReadVarint32(local_90,&local_6c);
                            if (!(bool)local_55) break;
                            *puStack_68 = local_6c;
                            RepeatedField<int>::AddAlreadyReserved
                                      (_elements_already_reserved,(int *)&local_9c);
                            local_a0 = local_a0 + -1;
                          }
                          local_7d = '\0';
                        }
                        else {
                          local_7d = '\0';
                        }
LAB_002ef4ad:
                        if (local_7d == '\0') {
                          return false;
                        }
LAB_002ef513:
                        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'P')) {
                          io::CodedInputStream::Advance(input,1);
                          bVar2 = true;
                        }
                        else {
                          bVar2 = false;
                        }
                      } while (bVar2);
                      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'X')) {
                        io::CodedInputStream::Advance(input,1);
                        bVar2 = true;
                      }
                      else {
                        bVar2 = false;
                      }
                      if (bVar2) {
LAB_002ef779:
                        do {
                          _elements_already_reserved_1 = mutable_weak_dependency(this);
                          local_bc = 1;
                          local_c0 = 0x58;
                          puStack_20 = &local_d4;
                          local_c8 = input;
                          local_18 = input;
                          local_9 = io::CodedInputStream::ReadVarint32(input,&local_24);
                          if ((bool)local_9) {
                            *puStack_20 = local_24;
                            RepeatedField<int>::Add(_elements_already_reserved_1,(int *)&local_d4);
                            local_d8 = RepeatedField<int>::Capacity(_elements_already_reserved_1);
                            iVar4 = RepeatedField<int>::size(_elements_already_reserved_1);
                            local_d8 = local_d8 - iVar4;
                            while( true ) {
                              pCVar1 = local_c8;
                              local_33d = '\0';
                              if (0 < local_d8) {
                                local_b0 = local_c8;
                                local_b4 = local_c0;
                                if (local_c0 < 0x80) {
                                  if ((local_c8->buffer_ < local_c8->buffer_end_) &&
                                     (*local_c8->buffer_ == local_c0)) {
                                    io::CodedInputStream::Advance(local_c8,1);
                                    local_a1 = '\x01';
                                  }
                                  else {
                                    local_a1 = '\0';
                                  }
                                }
                                else if (local_c0 < 0x4000) {
                                  iVar4 = io::CodedInputStream::BufferSize(local_c8);
                                  if (((iVar4 < 2) ||
                                      ((uint)*pCVar1->buffer_ != (local_b4 & 0xff | 0x80))) ||
                                     ((uint)pCVar1->buffer_[1] != (local_b4 >> 7 & 0xff))) {
                                    local_a1 = '\0';
                                  }
                                  else {
                                    io::CodedInputStream::Advance(pCVar1,2);
                                    local_a1 = '\x01';
                                  }
                                }
                                else {
                                  local_a1 = '\0';
                                }
                                local_33d = local_a1;
                              }
                              if (local_33d == '\0') {
                                local_b5 = '\x01';
                                goto LAB_002efa06;
                              }
                              local_30 = local_c8;
                              puStack_38 = &local_d4;
                              local_25 = io::CodedInputStream::ReadVarint32(local_c8,&local_3c);
                              if (!(bool)local_25) break;
                              *puStack_38 = local_3c;
                              RepeatedField<int>::AddAlreadyReserved
                                        (_elements_already_reserved_1,(int *)&local_d4);
                              local_d8 = local_d8 + -1;
                            }
                            local_b5 = '\0';
                          }
                          else {
                            local_b5 = '\0';
                          }
LAB_002efa06:
                          if (local_b5 == '\0') {
                            return false;
                          }
LAB_002efa6f:
                          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'X')) {
                            io::CodedInputStream::Advance(input,1);
                            bVar2 = true;
                          }
                          else {
                            bVar2 = false;
                          }
                        } while (bVar2);
                        bVar2 = io::CodedInputStream::ExpectAtEnd(input);
                        if (bVar2) {
                          return true;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_002edd77;
  case 2:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002ee01c;
    break;
  case 3:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002ee1da;
    break;
  case 4:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002ee4dd;
    break;
  case 5:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002ee77f;
    break;
  case 6:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002eea21;
    break;
  case 7:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002eecc3;
    break;
  case 8:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002eef65;
    break;
  case 9:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002ef0e0;
    break;
  case 10:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_VARINT) goto LAB_002ef25f;
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) {
      pRVar8 = mutable_public_dependency(this);
      bVar2 = internal::WireFormatLite::
              ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,pRVar8);
      if (bVar2) goto LAB_002ef513;
      return false;
    }
    break;
  case 0xb:
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_VARINT) goto LAB_002ef779;
    WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
    if (WVar5 == WIRETYPE_LENGTH_DELIMITED) {
      pRVar8 = mutable_weak_dependency(this);
      bVar2 = internal::WireFormatLite::
              ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,pRVar8);
      if (bVar2) goto LAB_002efa6f;
      return false;
    }
  }
  WVar5 = internal::WireFormatLite::GetTagWireType(local_1f0);
  if (WVar5 == WIRETYPE_END_GROUP) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar2 = internal::WireFormat::SkipField(input,local_1f0,unknown_fields);
  if (!bVar2) {
    return false;
  }
  goto LAB_002edd77;
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_package;
        break;
      }

      // optional string package = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_dependency:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        if (input->ExpectTag(34)) goto parse_message_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_message_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_message_type;
        if (input->ExpectTag(42)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_enum_type;
        if (input->ExpectTag(50)) goto parse_service;
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_service:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_service;
        if (input->ExpectTag(58)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_extension;
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_source_code_info;
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_source_code_info:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_public_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80, input, this->mutable_public_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88, input, this->mutable_weak_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}